

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

char * __thiscall Path::basename(Path *this,char *__filename)

{
  long lVar1;
  
  if (*(long *)(__filename + 8) == 0) {
    *(Path **)this = this + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char)__filename,0x2f);
    if (lVar1 == -1) {
      *(Path **)this = this + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this,*(long *)__filename,*(long *)(__filename + 8) + *(long *)__filename)
      ;
    }
    else {
      std::__cxx11::string::substr((ulong)this,(ulong)__filename);
    }
  }
  return (char *)this;
}

Assistant:

string basename(const string &path)
{
	if (path.empty())
		return "";

	auto index = find_last_slash(path);
	if (index == string::npos)
		return path;

	auto base = path.substr(index + 1, string::npos);
	return base;
}